

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O2

void pta_free(matras_allocator *allocator,void *p)

{
  iterator iVar1;
  void *local_18;
  void *p_local;
  
  local_18 = p;
  iVar1 = std::
          _Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>
          ::find(&AllocatedBlocks._M_t,&local_18);
  if ((_Rb_tree_header *)iVar1._M_node != &AllocatedBlocks._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>::
    erase(&AllocatedBlocks._M_t,&local_18);
    if (local_18 != (void *)0x0) {
      operator_delete__(local_18);
    }
    AllocatedCount = AllocatedCount - 1;
    return;
  }
  fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
          "AllocatedBlocks.find(p) != AllocatedBlocks.end()","false",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x29,
          "pta_free");
  exit(-1);
}

Assistant:

static void
pta_free(struct matras_allocator *allocator, void *p)
{
	(void)allocator;
	fail_unless(AllocatedBlocks.find(p) != AllocatedBlocks.end());
	AllocatedBlocks.erase(p);
	delete [] static_cast<char *>(p);
	AllocatedCount--;
}